

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::RunContext(RunContext *this,IConfigPtr *_config,IStreamingReporterPtr *reporter)

{
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  IMutableContext *pIVar4;
  pointer pIVar5;
  byte local_d9;
  byte bStack_4d;
  string local_40;
  IStreamingReporterPtr *local_20;
  IStreamingReporterPtr *reporter_local;
  IConfigPtr *_config_local;
  RunContext *this_local;
  
  local_20 = reporter;
  reporter_local = (IStreamingReporterPtr *)_config;
  _config_local = (IConfigPtr *)this;
  IResultCapture::IResultCapture(&this->super_IResultCapture);
  IRunner::IRunner(&this->super_IRunner);
  (this->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__RunContext_0026e0b0;
  (this->super_IRunner)._vptr_IRunner = (_func_int **)&PTR__RunContext_0026e170;
  peVar3 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)reporter_local);
  (*(peVar3->super_NonCopyable)._vptr_NonCopyable[4])(&local_40);
  TestRunInfo::TestRunInfo(&this->m_runInfo,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pIVar4 = getCurrentMutableContext();
  this->m_context = pIVar4;
  this->m_activeTestCase = (TestCase *)0x0;
  this->m_testCaseTracker = (ITracker *)0x0;
  Option<Catch::AssertionResult>::Option(&this->m_lastResult);
  clara::std::shared_ptr<const_Catch::IConfig>::shared_ptr
            (&this->m_config,(shared_ptr<const_Catch::IConfig> *)reporter_local);
  Totals::Totals(&this->m_totals);
  clara::std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
  ::unique_ptr(&this->m_reporter,local_20);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->m_messages);
  clara::std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::vector
            (&this->m_messageScopes);
  (this->m_lastAssertionInfo).macroName.m_start = (char *)0x0;
  (this->m_lastAssertionInfo).macroName.m_size = 0;
  StringRef::StringRef(&(this->m_lastAssertionInfo).macroName);
  SourceLineInfo::SourceLineInfo(&(this->m_lastAssertionInfo).lineInfo,"",0);
  (this->m_lastAssertionInfo).capturedExpression.m_start = (char *)0x0;
  (this->m_lastAssertionInfo).capturedExpression.m_size = 0;
  StringRef::StringRef(&(this->m_lastAssertionInfo).capturedExpression);
  (this->m_lastAssertionInfo).resultDisposition = Normal;
  clara::std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::vector
            (&this->m_unfinishedSections);
  clara::std::
  vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ::vector(&this->m_activeSections);
  TestCaseTracking::TrackerContext::TrackerContext(&this->m_trackerContext);
  FatalConditionHandler::FatalConditionHandler(&this->m_fatalConditionhandler);
  this->m_lastAssertionPassed = false;
  this->m_shouldReportUnexpected = true;
  peVar3 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_config);
  uVar1 = (*(peVar3->super_NonCopyable)._vptr_NonCopyable[5])();
  local_d9 = 1;
  if ((uVar1 & 1) == 0) {
    pIVar5 = clara::std::
             unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
             ::operator->(&this->m_reporter);
    iVar2 = (*pIVar5->_vptr_IStreamingReporter[2])();
    bStack_4d = (byte)((uint)iVar2 >> 8);
    local_d9 = bStack_4d;
  }
  this->m_includeSuccessfulResults = (bool)(local_d9 & 1);
  (*(this->m_context->super_IContext)._vptr_IContext[6])(this->m_context,&this->super_IRunner);
  (*(this->m_context->super_IContext)._vptr_IContext[7])(this->m_context,&this->m_config);
  (*(this->m_context->super_IContext)._vptr_IContext[5])();
  pIVar5 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->(&this->m_reporter);
  (*pIVar5->_vptr_IStreamingReporter[5])(pIVar5,&this->m_runInfo);
  return;
}

Assistant:

RunContext::RunContext(IConfigPtr const& _config, IStreamingReporterPtr&& reporter)
    :   m_runInfo(_config->name()),
        m_context(getCurrentMutableContext()),
        m_config(_config),
        m_reporter(std::move(reporter)),
        m_lastAssertionInfo{ StringRef(), SourceLineInfo("",0), StringRef(), ResultDisposition::Normal },
        m_includeSuccessfulResults( m_config->includeSuccessfulResults() || m_reporter->getPreferences().shouldReportAllAssertions )
    {
        m_context.setRunner(this);
        m_context.setConfig(m_config);
        m_context.setResultCapture(this);
        m_reporter->testRunStarting(m_runInfo);
    }